

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.hpp
# Opt level: O0

void __thiscall
websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::async_write
          (connection<websocketpp::config::asio::transport_config> *this,
          vector<websocketpp::transport::buffer,_std::allocator<websocketpp::transport::buffer>_>
          *bufs,write_handler *handler)

{
  bool bVar1;
  reference pbVar2;
  _Placeholder<2> *__args_3;
  function<void_(const_std::error_code_&)> *__args_1;
  wrapped_handler<asio::io_context::strand,_websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&,_unsigned_long)>_>,_asio::detail::is_continuation_if_running>
  *in_RDX;
  vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *in_RDI;
  const_iterator it;
  value_type *in_stack_fffffffffffffe68;
  vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *in_stack_fffffffffffffe70;
  wrapped_handler<asio::io_context::strand,_websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&,_unsigned_long)>_>,_asio::detail::is_continuation_if_running>
  *this_00;
  pointer *__args;
  connection<websocketpp::config::asio::transport_config> *this_01;
  custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&,_unsigned_long)>_>
  *in_stack_fffffffffffffe90;
  strand *in_stack_fffffffffffffe98;
  basic_stream_socket<asio::ip::tcp> *in_stack_fffffffffffffeb0;
  undefined1 local_140 [32];
  _Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&,_unsigned_long)>
  *in_stack_fffffffffffffee0;
  handler_allocator *in_stack_fffffffffffffee8;
  _Any_data local_20 [2];
  
  __gnu_cxx::
  __normal_iterator<const_websocketpp::transport::buffer_*,_std::vector<websocketpp::transport::buffer,_std::allocator<websocketpp::transport::buffer>_>_>
  ::__normal_iterator((__normal_iterator<const_websocketpp::transport::buffer_*,_std::vector<websocketpp::transport::buffer,_std::allocator<websocketpp::transport::buffer>_>_>
                       *)local_20);
  local_20[0]._0_8_ =
       std::vector<websocketpp::transport::buffer,_std::allocator<websocketpp::transport::buffer>_>
       ::begin((vector<websocketpp::transport::buffer,_std::allocator<websocketpp::transport::buffer>_>
                *)in_stack_fffffffffffffe68);
  while( true ) {
    std::vector<websocketpp::transport::buffer,_std::allocator<websocketpp::transport::buffer>_>::
    end((vector<websocketpp::transport::buffer,_std::allocator<websocketpp::transport::buffer>_> *)
        in_stack_fffffffffffffe68);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_websocketpp::transport::buffer_*,_std::vector<websocketpp::transport::buffer,_std::allocator<websocketpp::transport::buffer>_>_>
                        *)in_stack_fffffffffffffe70,
                       (__normal_iterator<const_websocketpp::transport::buffer_*,_std::vector<websocketpp::transport::buffer,_std::allocator<websocketpp::transport::buffer>_>_>
                        *)in_stack_fffffffffffffe68);
    if (!bVar1) break;
    in_stack_fffffffffffffe98 = (strand *)(in_RDI + 9);
    pbVar2 = __gnu_cxx::
             __normal_iterator<const_websocketpp::transport::buffer_*,_std::vector<websocketpp::transport::buffer,_std::allocator<websocketpp::transport::buffer>_>_>
             ::operator*((__normal_iterator<const_websocketpp::transport::buffer_*,_std::vector<websocketpp::transport::buffer,_std::allocator<websocketpp::transport::buffer>_>_>
                          *)local_20);
    in_stack_fffffffffffffe90 =
         (custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&,_unsigned_long)>_>
          *)pbVar2->buf;
    __gnu_cxx::
    __normal_iterator<const_websocketpp::transport::buffer_*,_std::vector<websocketpp::transport::buffer,_std::allocator<websocketpp::transport::buffer>_>_>
    ::operator*((__normal_iterator<const_websocketpp::transport::buffer_*,_std::vector<websocketpp::transport::buffer,_std::allocator<websocketpp::transport::buffer>_>_>
                 *)local_20);
    ::asio::buffer(in_stack_fffffffffffffe70,(size_t)in_stack_fffffffffffffe68);
    std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>::push_back
              (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    __gnu_cxx::
    __normal_iterator<const_websocketpp::transport::buffer_*,_std::vector<websocketpp::transport::buffer,_std::allocator<websocketpp::transport::buffer>_>_>
    ::operator++((__normal_iterator<const_websocketpp::transport::buffer_*,_std::vector<websocketpp::transport::buffer,_std::allocator<websocketpp::transport::buffer>_>_>
                  *)local_20);
  }
  __args_3 = (_Placeholder<2> *)basic_socket::connection::get_socket((connection *)0x2d14f1);
  this_00 = (wrapped_handler<asio::io_context::strand,_websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&,_unsigned_long)>_>,_asio::detail::is_continuation_if_running>
             *)(in_RDI + 9);
  __args_1 = (function<void_(const_std::error_code_&)> *)
             std::
             __shared_ptr_access<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2d1514);
  __args = &in_RDI[0x38].super__Vector_base<asio::const_buffer,_std::allocator<asio::const_buffer>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_140._16_8_ = handle_async_write;
  local_140._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_01 = (connection<websocketpp::config::asio::transport_config> *)local_140;
  get_shared(this_01);
  std::
  bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*)(std::function<void(std::error_code_const&)>,std::error_code_const&,unsigned_long),std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>>,std::function<void(std::error_code_const&)>&,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
            ((offset_in_connection<websocketpp::config::asio::transport_config>_to_subr *)this_01,
             (shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>
              *)__args,__args_1,(_Placeholder<1> *)this_00,__args_3);
  make_custom_alloc_handler<std::_Bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>>,std::function<void(std::error_code_const&)>,std::_Placeholder<1>,std::_Placeholder<2>))(std::function<void(std::error_code_const&)>,std::error_code_const&,unsigned_long)>>
            (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  ::asio::io_context::strand::
  wrap<websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>>,std::function<void(std::error_code_const&)>,std::_Placeholder<1>,std::_Placeholder<2>))(std::function<void(std::error_code_const&)>,std::error_code_const&,unsigned_long)>>>
            (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  ::asio::
  async_write<asio::basic_stream_socket<asio::ip::tcp>,std::vector<asio::const_buffer,std::allocator<asio::const_buffer>>,asio::detail::wrapped_handler<asio::io_context::strand,websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>>,std::function<void(std::error_code_const&)>,std::_Placeholder<1>,std::_Placeholder<2>))(std::function<void(std::error_code_const&)>,std::error_code_const&,unsigned_long)>>,asio::detail::is_continuation_if_running>>
            (in_stack_fffffffffffffeb0,in_RDI,in_RDX,in_stack_fffffffffffffe98);
  ::asio::detail::
  wrapped_handler<asio::io_context::strand,_websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&,_unsigned_long)>_>,_asio::detail::is_continuation_if_running>
  ::~wrapped_handler(this_00);
  custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&,_unsigned_long)>_>
  ::~custom_alloc_handler
            ((custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&,_unsigned_long)>_>
              *)0x2d15e4);
  std::
  _Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&,_unsigned_long)>
  ::~_Bind((_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&,_unsigned_long)>
            *)0x2d15ee);
  std::
  shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>
  ::~shared_ptr((shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>
                 *)0x2d15f8);
  return;
}

Assistant:

void async_write(std::vector<buffer> const & bufs, write_handler handler) {
        std::vector<buffer>::const_iterator it;

        for (it = bufs.begin(); it != bufs.end(); ++it) {
            m_bufs.push_back(lib::asio::buffer((*it).buf,(*it).len));
        }

        if (config::enable_multithreading) {
            lib::asio::async_write(
                socket_con_type::get_socket(),
                m_bufs,
                m_strand->wrap(make_custom_alloc_handler(
                    m_write_handler_allocator,
                    lib::bind(
                        &type::handle_async_write, get_shared(),
                        handler,
                        lib::placeholders::_1, lib::placeholders::_2
                    )
                ))
            );
        } else {
            lib::asio::async_write(
                socket_con_type::get_socket(),
                m_bufs,
                make_custom_alloc_handler(
                    m_write_handler_allocator,
                    lib::bind(
                        &type::handle_async_write, get_shared(),
                        handler,
                        lib::placeholders::_1, lib::placeholders::_2
                    )
                )
            );
        }
    }